

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaReadAig.c
# Opt level: O3

Aig_Man_t * Ioa_ReadAigerFromMemory(char *pContents,int nFileSize,int fCheck)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong *puVar8;
  Aig_Obj_t *pAVar9;
  void *pvVar10;
  uint *__ptr;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  Aig_Man_t *p;
  size_t __size;
  char *pcVar18;
  Vec_Int_t *pVVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  byte *pbVar24;
  ulong uVar25;
  byte *pbVar26;
  byte *pbVar27;
  bool bVar28;
  ulong local_a8;
  byte *local_a0;
  uint *local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  uint *local_78;
  Vec_Int_t *local_70;
  ulong local_68;
  Aig_Man_t *local_60;
  uint local_54;
  char *local_50;
  uint local_44;
  int local_40;
  int local_3c;
  ulong local_38;
  
  if ((((*pContents != 'a') || (pContents[1] != 'i')) || (pContents[2] != 'g')) ||
     ((pbVar24 = (byte *)pContents, pContents[3] != '2' && (pContents[3] != ' ')))) {
    pcVar18 = "Wrong input file format.\n";
    __size = 0x19;
LAB_0074b61d:
    fwrite(pcVar18,__size,1,_stdout);
    return (Aig_Man_t *)0x0;
  }
  do {
    bVar11 = *pbVar24;
    pbVar24 = pbVar24 + 1;
  } while (bVar11 != 0x20);
  local_a0 = pbVar24;
  iVar3 = atoi((char *)pbVar24);
  local_98 = (uint *)CONCAT44(local_98._4_4_,iVar3);
  do {
    bVar11 = *pbVar24;
    pbVar24 = pbVar24 + 1;
  } while (bVar11 != 0x20);
  local_a0 = pbVar24;
  uVar4 = atoi((char *)pbVar24);
  do {
    bVar11 = *pbVar24;
    pbVar24 = pbVar24 + 1;
  } while (bVar11 != 0x20);
  local_a0 = pbVar24;
  iVar3 = atoi((char *)pbVar24);
  local_68 = CONCAT44(extraout_var,iVar3);
  do {
    bVar11 = *pbVar24;
    pbVar24 = pbVar24 + 1;
  } while (bVar11 != 0x20);
  local_a0 = pbVar24;
  uVar5 = atoi((char *)pbVar24);
  do {
    bVar11 = *pbVar24;
    pbVar24 = pbVar24 + 1;
  } while (bVar11 != 0x20);
  local_a0 = pbVar24;
  iVar3 = atoi((char *)pbVar24);
  local_88 = CONCAT44(extraout_var_00,iVar3);
LAB_0074b5f4:
  if (*pbVar24 == 10) {
    local_54 = 0;
  }
  else {
    if (*pbVar24 != 0x20) goto code_r0x0074b602;
    if (uVar5 != 0) {
      __assert_fail("nOutputs == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ioa/ioaReadAig.c"
                    ,0x89,"Aig_Man_t *Ioa_ReadAigerFromMemory(char *, int, int)");
    }
    pbVar24 = pbVar24 + 1;
    local_a0 = pbVar24;
    uVar5 = atoi((char *)pbVar24);
    for (; (*pbVar24 != 10 && (*pbVar24 != 0x20)); pbVar24 = pbVar24 + 1) {
    }
    local_54 = (uint)(uVar5 != 0);
  }
  local_90 = (ulong)uVar5;
  bVar11 = *pbVar24;
  bVar28 = false;
  if (bVar11 == 0x20) {
    pbVar24 = pbVar24 + 1;
    local_a0 = pbVar24;
    uVar6 = atoi((char *)pbVar24);
    for (; (*pbVar24 != 10 && (*pbVar24 != 0x20)); pbVar24 = pbVar24 + 1) {
    }
    local_90 = (ulong)(uVar6 + uVar5);
    bVar11 = *pbVar24;
    if (bVar11 == 0x20) {
      pbVar24 = pbVar24 + 1;
      local_a0 = pbVar24;
      local_80 = (ulong)uVar4;
      iVar3 = atoi((char *)pbVar24);
      for (; (*pbVar24 != 10 && (*pbVar24 != 0x20)); pbVar24 = pbVar24 + 1) {
      }
      local_90 = (ulong)(uint)((int)local_90 + iVar3);
      bVar28 = iVar3 != 0;
      bVar11 = *pbVar24;
      if (bVar11 == 0x20) {
        pbVar24 = pbVar24 + 1;
        local_a0 = pbVar24;
        iVar7 = atoi((char *)pbVar24);
        uVar4 = (uint)local_80;
        for (; (*pbVar24 != 10 && (*pbVar24 != 0x20)); pbVar24 = pbVar24 + 1) {
        }
        local_90 = (ulong)(uint)((int)local_90 + iVar7);
        bVar11 = *pbVar24;
        bVar28 = iVar3 != 0 || iVar7 != 0;
        local_a0 = pbVar24;
      }
      else {
        uVar4 = (uint)local_80;
        local_a0 = pbVar24;
      }
    }
    else {
      bVar28 = false;
      local_a0 = pbVar24;
    }
  }
  else {
    uVar6 = 0;
    local_a0 = pbVar24;
  }
  if (bVar11 != 10) {
    pcVar18 = "The parameter line is in a wrong format.\n";
    __size = 0x29;
    goto LAB_0074b61d;
  }
  pbVar24 = local_a0 + 1;
  uVar20 = (ulong)(uVar4 + (int)local_68);
  uVar4 = (int)local_88 + uVar4 + (int)local_68;
  local_a0 = pbVar24;
  if ((uint)local_98 != uVar4) {
    pcVar18 = "The number of objects does not match.\n";
    __size = 0x26;
    goto LAB_0074b61d;
  }
  if (bVar28) {
    pcVar18 = "Reading AIGER files with liveness properties are currently not supported.\n";
    __size = 0x4a;
    goto LAB_0074b61d;
  }
  local_80 = uVar20;
  local_40 = nFileSize;
  if (uVar6 != 0) {
    if (uVar6 == 1) {
      fwrite("Warning: The last output is interpreted as a constraint.\n",0x39,1,_stdout);
    }
    else {
      fprintf(_stdout,"Warning: The last %d outputs are interpreted as constraints.\n",(ulong)uVar6)
      ;
    }
  }
  iVar7 = (int)local_88;
  local_60 = Aig_ManStart(iVar7);
  local_60->nConstrs = uVar6;
  iVar3 = (int)local_80;
  local_44 = uVar6;
  local_78 = (uint *)malloc(0x10);
  p = local_60;
  local_a8 = 8;
  if (6 < uVar4) {
    local_a8 = (ulong)(iVar3 + iVar7 + 1);
  }
  uVar4 = (uint)local_a8;
  *local_78 = uVar4;
  if (uVar4 == 0) {
    local_98 = local_78 + 2;
    pAVar9 = local_60->pConst1;
    puVar8 = (ulong *)malloc(0x80);
    *(ulong **)(local_78 + 2) = puVar8;
    *local_78 = 0x10;
    local_a8 = 0x10;
  }
  else {
    puVar8 = (ulong *)malloc((long)(int)uVar4 << 3);
    local_98 = local_78 + 2;
    *(ulong **)(local_78 + 2) = puVar8;
    pAVar9 = local_60->pConst1;
    p = local_60;
  }
  local_78[1] = 1;
  *puVar8 = (ulong)pAVar9 ^ 1;
  iVar3 = (int)local_80;
  local_3c = fCheck;
  if (iVar3 < 1) {
    uVar20 = 1;
  }
  else {
    uVar20 = 1;
    uVar4 = 2;
    do {
      pAVar9 = Aig_ObjCreateCi(p);
      iVar7 = (int)local_a8;
      if ((int)uVar20 == iVar7) {
        if (iVar7 < 0x10) {
          if (*(void **)local_98 == (void *)0x0) {
            pvVar10 = malloc(0x80);
          }
          else {
            pvVar10 = realloc(*(void **)local_98,0x80);
          }
          *(void **)(local_78 + 2) = pvVar10;
          *local_78 = 0x10;
          local_a8 = 0x10;
        }
        else {
          local_a8 = (ulong)(uint)(iVar7 * 2);
          if (*(void **)local_98 == (void *)0x0) {
            pvVar10 = malloc(local_a8 * 8);
          }
          else {
            pvVar10 = realloc(*(void **)local_98,local_a8 * 8);
          }
          *(void **)(local_78 + 2) = pvVar10;
          *local_78 = iVar7 * 2;
        }
      }
      else {
        pvVar10 = *(void **)local_98;
      }
      local_78[1] = uVar4;
      *(Aig_Obj_t **)((long)pvVar10 + uVar20 * 8) = pAVar9;
      uVar20 = uVar20 + 1;
      iVar7 = uVar4 - iVar3;
      uVar4 = uVar4 + 1;
      pbVar24 = local_a0;
    } while (iVar7 != 1);
  }
  p->nRegs = (int)local_68;
  uVar4 = (int)local_90 + (int)local_68;
  local_38 = (ulong)uVar4;
  if (pContents[3] == ' ') {
    local_a0 = pbVar24;
    if (0 < (int)uVar4) {
      iVar3 = 0;
      pbVar27 = pbVar24;
      do {
        local_a0 = pbVar27 + 1;
        iVar3 = iVar3 + (uint)(*pbVar27 == 10);
        pbVar27 = local_a0;
      } while (iVar3 < (int)uVar4);
    }
    local_70 = (Vec_Int_t *)0x0;
  }
  else {
    local_70 = Ioa_WriteDecodeLiterals((char **)&local_a0,uVar4);
  }
  pbVar27 = local_a0;
  local_50 = pContents;
  if (0 < (int)local_88) {
    iVar3 = 0;
    uVar14 = uVar20 & 0xffffffff;
    do {
      bVar11 = *pbVar27;
      bVar12 = 0;
      uVar4 = 0;
      while( true ) {
        pbVar26 = pbVar27 + 1;
        if (-1 < (char)bVar11) break;
        uVar4 = uVar4 | (bVar11 & 0x7f) << (bVar12 & 0x1f);
        bVar11 = *pbVar26;
        bVar12 = bVar12 + 7;
        pbVar27 = pbVar26;
      }
      uVar5 = (uint)*pbVar26;
      pbVar27 = pbVar27 + 2;
      bVar13 = 0;
      if ((char)*pbVar26 < '\0') {
        bVar13 = 0;
        uVar6 = 0;
        do {
          uVar6 = uVar6 | (uVar5 & 0x7f) << (bVar13 & 0x1f);
          bVar1 = *pbVar27;
          uVar5 = (uint)bVar1;
          pbVar27 = pbVar27 + 1;
          bVar13 = bVar13 + 7;
        } while ((char)bVar1 < '\0');
      }
      else {
        uVar6 = 0;
      }
      uVar21 = (int)local_80 + iVar3 + 1;
      uVar15 = uVar21 * 2 - ((uint)bVar11 << (bVar12 & 0x1f) | uVar4);
      uVar5 = uVar15 - (uVar5 << (bVar13 & 0x1f) | uVar6);
      uVar4 = uVar5 >> 1;
      if (((int)uVar14 <= (int)uVar4) || (uVar14 <= uVar15 >> 1)) goto LAB_0074c160;
      if (uVar14 != uVar21) {
        __assert_fail("Vec_PtrSize(vNodes) == i + 1 + nInputs + nLatches",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ioa/ioaReadAig.c"
                      ,0x100,"Aig_Man_t *Ioa_ReadAigerFromMemory(char *, int, int)");
      }
      pvVar10 = *(void **)local_98;
      pAVar9 = Aig_And(local_60,(Aig_Obj_t *)
                                ((ulong)(uVar5 & 1) ^ *(ulong *)((long)pvVar10 + (ulong)uVar4 * 8)),
                       (Aig_Obj_t *)
                       ((ulong)(uVar15 & 1) ^ *(ulong *)((long)pvVar10 + (ulong)(uVar15 >> 1) * 8)))
      ;
      if (uVar14 == local_a8) {
        if (uVar14 < 0x10) {
          pvVar10 = realloc(pvVar10,0x80);
          *(void **)local_98 = pvVar10;
          local_a8 = 0x10;
        }
        else {
          pvVar10 = realloc(pvVar10,uVar14 << 4);
          *(void **)local_98 = pvVar10;
          local_a8 = (ulong)(uint)((int)uVar14 * 2);
        }
        *local_78 = (uint)local_a8;
      }
      iVar3 = iVar3 + 1;
      uVar20 = uVar14 + 1;
      local_78[1] = (uint)uVar20;
      *(Aig_Obj_t **)((long)pvVar10 + uVar14 * 8) = pAVar9;
      p = local_60;
      uVar14 = uVar20;
    } while (iVar3 != (int)local_88);
  }
  local_88 = uVar20;
  __ptr = (uint *)malloc(0x10);
  uVar20 = local_68;
  uVar4 = (uint)local_68;
  uVar14 = local_38 & 0xffffffff;
  if (((int)local_90 + uVar4) - 1 < 7) {
    uVar14 = 8;
  }
  __ptr[1] = 0;
  if ((int)uVar14 == 0) {
    pvVar10 = (void *)0x0;
  }
  else {
    pvVar10 = malloc((long)(int)uVar14 << 3);
  }
  *(void **)(__ptr + 2) = pvVar10;
  if (local_50[3] == ' ') {
    if ((int)uVar4 < 1) {
      uVar16 = 0;
      local_a0 = pbVar24;
    }
    else {
      uVar20 = 0;
      local_a0 = pbVar24;
      do {
        pbVar24 = local_a0;
        uVar5 = atoi((char *)local_a0);
        p = local_60;
        do {
          bVar11 = *pbVar24;
          pbVar24 = pbVar24 + 1;
        } while (bVar11 != 10);
        local_a0 = pbVar24;
        if ((int)local_88 <= (int)(uVar5 >> 1)) goto LAB_0074c160;
        uVar23 = *(ulong *)(*(long *)local_98 + (ulong)(uVar5 >> 1) * 8);
        iVar3 = (int)uVar14;
        if ((int)uVar20 == iVar3) {
          if (iVar3 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar10 = malloc(0x80);
            }
            else {
              pvVar10 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar10;
            *__ptr = 0x10;
            uVar14 = 0x10;
          }
          else {
            uVar14 = (ulong)(uint)(iVar3 * 2);
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar10 = malloc(uVar14 * 8);
            }
            else {
              pvVar10 = realloc(*(void **)(__ptr + 2),uVar14 * 8);
            }
            *(void **)(__ptr + 2) = pvVar10;
            *__ptr = iVar3 * 2;
          }
        }
        else {
          pvVar10 = *(void **)(__ptr + 2);
        }
        uVar6 = (int)uVar20 + 1;
        uVar16 = (ulong)uVar6;
        *(ulong *)((long)pvVar10 + uVar20 * 8) = uVar5 & 1 ^ uVar23;
        uVar20 = uVar16;
      } while (uVar6 != uVar4);
    }
    uVar5 = (uint)uVar16;
    if (0 < (int)local_90) {
      iVar3 = 0;
      do {
        pbVar24 = local_a0;
        uVar4 = atoi((char *)local_a0);
        p = local_60;
        do {
          bVar11 = *pbVar24;
          pbVar24 = pbVar24 + 1;
        } while (bVar11 != 10);
        local_a0 = pbVar24;
        if ((int)local_88 <= (int)(uVar4 >> 1)) goto LAB_0074c160;
        uVar20 = *(ulong *)(*(long *)local_98 + (ulong)(uVar4 >> 1) * 8);
        iVar22 = (int)uVar16;
        iVar7 = (int)uVar14;
        if (iVar22 == iVar7) {
          if (iVar7 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar10 = malloc(0x80);
            }
            else {
              pvVar10 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar10;
            *__ptr = 0x10;
            uVar14 = 0x10;
          }
          else {
            uVar14 = (ulong)(uint)(iVar7 * 2);
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar10 = malloc(uVar14 * 8);
            }
            else {
              pvVar10 = realloc(*(void **)(__ptr + 2),uVar14 * 8);
            }
            *(void **)(__ptr + 2) = pvVar10;
            *__ptr = iVar7 * 2;
          }
        }
        else {
          pvVar10 = *(void **)(__ptr + 2);
        }
        uVar5 = iVar22 + 1;
        uVar16 = (ulong)uVar5;
        *(ulong *)((long)pvVar10 + (long)iVar22 * 8) = uVar4 & 1 ^ uVar20;
        iVar3 = iVar3 + 1;
        uVar20 = local_90;
      } while (iVar3 != (int)local_90);
      goto LAB_0074bff2;
    }
  }
  else {
    uVar16 = local_88;
    pVVar19 = local_70;
    if ((int)uVar4 < 1) {
      uVar23 = 0;
    }
    else {
      uVar25 = 0;
      do {
        if ((long)pVVar19->nSize <= (long)uVar25) goto LAB_0074c17f;
        uVar4 = pVVar19->pArray[uVar25];
        uVar5 = uVar4 >> 1;
        if ((int)uVar16 <= (int)uVar5) goto LAB_0074c160;
        uVar2 = *(ulong *)(*(long *)local_98 + (ulong)uVar5 * 8);
        iVar3 = (int)uVar14;
        if ((int)uVar25 == iVar3) {
          if (iVar3 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar10 = malloc(0x80);
            }
            else {
              pvVar10 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar10;
            *__ptr = 0x10;
            uVar14 = 0x10;
            uVar16 = local_88;
            pVVar19 = local_70;
          }
          else {
            uVar14 = (ulong)(uint)(iVar3 * 2);
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar10 = malloc(uVar14 * 8);
            }
            else {
              pvVar10 = realloc(*(void **)(__ptr + 2),uVar14 * 8);
            }
            *(void **)(__ptr + 2) = pvVar10;
            *__ptr = iVar3 * 2;
            uVar16 = local_88;
            pVVar19 = local_70;
          }
        }
        else {
          pvVar10 = *(void **)(__ptr + 2);
        }
        uVar23 = uVar25 + 1;
        __ptr[1] = (uint)uVar23;
        *(ulong *)((long)pvVar10 + uVar25 * 8) = uVar4 & 1 ^ uVar2;
        uVar25 = uVar23;
      } while ((uVar20 & 0xffffffff) != uVar23);
      uVar4 = (uint)local_68;
    }
    if (0 < (int)local_90) {
      lVar17 = (long)(int)uVar4;
      uVar25 = local_90 & 0xffffffff;
      uVar20 = uVar23 & 0xffffffff;
      do {
        if (((int)local_68 < 0) || (pVVar19->nSize <= lVar17)) {
LAB_0074c17f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar4 = pVVar19->pArray[lVar17];
        uVar5 = uVar4 >> 1;
        if ((int)uVar16 <= (int)uVar5) goto LAB_0074c160;
        uVar2 = *(ulong *)(*(long *)local_98 + (ulong)uVar5 * 8);
        iVar3 = (int)uVar14;
        if ((int)uVar20 == iVar3) {
          if (iVar3 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar10 = malloc(0x80);
            }
            else {
              pvVar10 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar10;
            *__ptr = 0x10;
            uVar14 = 0x10;
            uVar16 = local_88;
            pVVar19 = local_70;
          }
          else {
            uVar14 = (ulong)(uint)(iVar3 * 2);
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar10 = malloc(uVar14 * 8);
            }
            else {
              pvVar10 = realloc(*(void **)(__ptr + 2),uVar14 * 8);
            }
            *(void **)(__ptr + 2) = pvVar10;
            *__ptr = iVar3 * 2;
            uVar16 = local_88;
            pVVar19 = local_70;
          }
        }
        else {
          pvVar10 = *(void **)(__ptr + 2);
        }
        uVar23 = uVar20 + 1;
        __ptr[1] = (uint)uVar23;
        *(ulong *)((long)pvVar10 + uVar20 * 8) = uVar4 & 1 ^ uVar2;
        lVar17 = lVar17 + 1;
        uVar25 = uVar25 - 1;
        p = local_60;
        uVar20 = uVar23;
      } while (uVar25 != 0);
    }
    uVar20 = local_90;
    uVar5 = (uint)uVar23;
    Vec_IntFree(pVVar19);
LAB_0074bff2:
    uVar4 = (uint)local_68;
    if (0 < (int)uVar20) {
      uVar14 = local_68 & 0xffffffff;
      uVar20 = uVar20 & 0xffffffff;
      do {
        if (((int)uVar4 < 0) || ((int)uVar5 <= (int)uVar14)) goto LAB_0074c160;
        Aig_ObjCreateCo(p,*(Aig_Obj_t **)(*(long *)(__ptr + 2) + uVar14 * 8));
        uVar14 = uVar14 + 1;
        uVar20 = uVar20 - 1;
      } while (uVar20 != 0);
    }
  }
  if ((int)uVar4 < 1) {
    pvVar10 = *(void **)(__ptr + 2);
    if (pvVar10 == (void *)0x0) goto LAB_0074c089;
  }
  else {
    uVar14 = 0;
    uVar20 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar20 = uVar14;
    }
    do {
      if (uVar20 == uVar14) {
LAB_0074c160:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar10 = *(void **)(__ptr + 2);
      Aig_ObjCreateCo(p,*(Aig_Obj_t **)((long)pvVar10 + uVar14 * 8));
      uVar14 = uVar14 + 1;
    } while (uVar4 != uVar14);
  }
  free(pvVar10);
LAB_0074c089:
  free(__ptr);
  local_a0 = pbVar27 + 1;
  pbVar24 = pbVar27;
  if (((local_a0 < local_50 + local_40) && (*pbVar27 == 99)) &&
     (pbVar24 = local_a0, *local_a0 == 0x6e)) {
    if (p->pName != (char *)0x0) {
      free(p->pName);
      p->pName = (char *)0x0;
    }
    pcVar18 = Abc_UtilStrsav((char *)(pbVar27 + 2));
    p->pName = pcVar18;
    pbVar24 = local_a0;
  }
  local_a0 = pbVar24;
  if (*(void **)local_98 != (void *)0x0) {
    free(*(void **)local_98);
  }
  bVar28 = local_44 == 0;
  free(local_78);
  Aig_ManCleanup(p);
  Aig_ManSetRegNum(p,p->nRegs);
  iVar3 = local_3c;
  if ((~(byte)local_54 & bVar28) == 0) {
    Aig_ManInvertConstraints(p);
  }
  if (iVar3 != 0) {
    iVar3 = Aig_ManCheck(p);
    if (iVar3 == 0) {
      puts("Ioa_ReadAiger: The network check has failed.");
      Aig_ManStop(p);
      return (Aig_Man_t *)0x0;
    }
    return p;
  }
  return p;
code_r0x0074b602:
  pbVar24 = pbVar24 + 1;
  goto LAB_0074b5f4;
}

Assistant:

Aig_Man_t * Ioa_ReadAigerFromMemory( char * pContents, int nFileSize, int fCheck )
{
    Vec_Int_t * vLits = NULL;
    Vec_Ptr_t * vNodes, * vDrivers;//, * vTerms;
    Aig_Obj_t * pObj, * pNode0, * pNode1;
    Aig_Man_t * pNew;
    int nTotal, nInputs, nOutputs, nLatches, nAnds, i;//, iTerm, nDigits;
    int nBad = 0, nConstr = 0, nJust = 0, nFair = 0;
    char * pDrivers, * pSymbols, * pCur;//, * pType;
    unsigned uLit0, uLit1, uLit;

    // check if the input file format is correct
    if ( strncmp(pContents, "aig", 3) != 0 || (pContents[3] != ' ' && pContents[3] != '2') )
    {
        fprintf( stdout, "Wrong input file format.\n" );
        return NULL;
    }

    // read the parameters (M I L O A + B C J F)
    pCur = pContents;         while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of objects
    nTotal = atoi( pCur );    while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of inputs
    nInputs = atoi( pCur );   while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of latches
    nLatches = atoi( pCur );  while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of outputs
    nOutputs = atoi( pCur );  while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of nodes
    nAnds = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
    if ( *pCur == ' ' )
    {
        assert( nOutputs == 0 );
        // read the number of properties
        pCur++;
        nBad = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nBad;
    }
    if ( *pCur == ' ' )
    {
        // read the number of properties
        pCur++;
        nConstr = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nConstr;
    }
    if ( *pCur == ' ' )
    {
        // read the number of properties
        pCur++;
        nJust = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nJust;
    }
    if ( *pCur == ' ' )
    {
        // read the number of properties
        pCur++;
        nFair = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nFair;
    }
    if ( *pCur != '\n' )
    {
        fprintf( stdout, "The parameter line is in a wrong format.\n" );
        return NULL;
    }
    pCur++;

    // check the parameters
    if ( nTotal != nInputs + nLatches + nAnds )
    {
        fprintf( stdout, "The number of objects does not match.\n" );
        return NULL;
    }
    if ( nJust || nFair )
    {
        fprintf( stdout, "Reading AIGER files with liveness properties are currently not supported.\n" );
        return NULL;
    }

    if ( nConstr )
    {
        if ( nConstr == 1 )
            fprintf( stdout, "Warning: The last output is interpreted as a constraint.\n" );
        else
            fprintf( stdout, "Warning: The last %d outputs are interpreted as constraints.\n", nConstr );
    }

    // allocate the empty AIG
    pNew = Aig_ManStart( nAnds );
    pNew->nConstrs = nConstr;

    // prepare the array of nodes
    vNodes = Vec_PtrAlloc( 1 + nInputs + nLatches + nAnds );
    Vec_PtrPush( vNodes, Aig_ManConst0(pNew) );

    // create the PIs
    for ( i = 0; i < nInputs + nLatches; i++ )
    {
        pObj = Aig_ObjCreateCi(pNew);    
        Vec_PtrPush( vNodes, pObj );
    }
/*
    // create the POs
    for ( i = 0; i < nOutputs + nLatches; i++ )
    {
        pObj = Aig_ObjCreateCo(pNew);   
    }
*/
    // create the latches
    pNew->nRegs = nLatches;
/*
    nDigits = Ioa_Base10Log( nLatches );
    for ( i = 0; i < nLatches; i++ )
    {
        pObj = Aig_ObjCreateLatch(pNew);
        Aig_LatchSetInit0( pObj );
        pNode0 = Aig_ObjCreateBi(pNew);
        pNode1 = Aig_ObjCreateBo(pNew);
        Aig_ObjAddFanin( pObj, pNode0 );
        Aig_ObjAddFanin( pNode1, pObj );
        Vec_PtrPush( vNodes, pNode1 );
        // assign names to latch and its input
//        Aig_ObjAssignName( pObj, Aig_ObjNameDummy("_L", i, nDigits), NULL );
//        printf( "Creating latch %s with input %d and output %d.\n", Aig_ObjName(pObj), pNode0->Id, pNode1->Id );
    } 
*/ 

    // remember the beginning of latch/PO literals
    pDrivers = pCur;
    if ( pContents[3] == ' ' ) // standard AIGER
    {
        // scroll to the beginning of the binary data
        for ( i = 0; i < nLatches + nOutputs; )
            if ( *pCur++ == '\n' )
                i++;
    }
    else // modified AIGER
    {
        vLits = Ioa_WriteDecodeLiterals( &pCur, nLatches + nOutputs );
    }

    // create the AND gates
//    pProgress = Bar_ProgressStart( stdout, nAnds );
    for ( i = 0; i < nAnds; i++ )
    {
//        Bar_ProgressUpdate( pProgress, i, NULL );
        uLit = ((i + 1 + nInputs + nLatches) << 1);
        uLit1 = uLit  - Ioa_ReadAigerDecode( &pCur );
        uLit0 = uLit1 - Ioa_ReadAigerDecode( &pCur );
//        assert( uLit1 > uLit0 );
        pNode0 = Aig_NotCond( (Aig_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), uLit0 & 1 );
        pNode1 = Aig_NotCond( (Aig_Obj_t *)Vec_PtrEntry(vNodes, uLit1 >> 1), uLit1 & 1 );
        assert( Vec_PtrSize(vNodes) == i + 1 + nInputs + nLatches );
        Vec_PtrPush( vNodes, Aig_And(pNew, pNode0, pNode1) );
    }
//    Bar_ProgressStop( pProgress );

    // remember the place where symbols begin
    pSymbols = pCur;

    // read the latch driver literals
    vDrivers = Vec_PtrAlloc( nLatches + nOutputs );
    if ( pContents[3] == ' ' ) // standard AIGER
    {
        pCur = pDrivers;
        for ( i = 0; i < nLatches; i++ )
        {
            uLit0 = atoi( pCur );  while ( *pCur++ != '\n' );
            pNode0 = Aig_NotCond( (Aig_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );//^ (uLit0 < 2) );
            Vec_PtrPush( vDrivers, pNode0 );
        }
        // read the PO driver literals
        for ( i = 0; i < nOutputs; i++ )
        {
            uLit0 = atoi( pCur );  while ( *pCur++ != '\n' );
            pNode0 = Aig_NotCond( (Aig_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );//^ (uLit0 < 2) );
            Vec_PtrPush( vDrivers, pNode0 );
        }

    }
    else
    {
        // read the latch driver literals
        for ( i = 0; i < nLatches; i++ )
        {
            uLit0 = Vec_IntEntry( vLits, i );
            pNode0 = Aig_NotCond( (Aig_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );//^ (uLit0 < 2) );
            Vec_PtrPush( vDrivers, pNode0 );
        }
        // read the PO driver literals
        for ( i = 0; i < nOutputs; i++ )
        {
            uLit0 = Vec_IntEntry( vLits, i+nLatches );
            pNode0 = Aig_NotCond( (Aig_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );//^ (uLit0 < 2) );
            Vec_PtrPush( vDrivers, pNode0 );
        }
        Vec_IntFree( vLits );
    }

    // create the POs
    for ( i = 0; i < nOutputs; i++ )
        Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Vec_PtrEntry(vDrivers, nLatches + i) );
    for ( i = 0; i < nLatches; i++ )
        Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Vec_PtrEntry(vDrivers, i) );
    Vec_PtrFree( vDrivers );

/*
    // read the names if present
    pCur = pSymbols;
    if ( *pCur != 'c' )
    {
        int Counter = 0;
        while ( pCur < pContents + nFileSize && *pCur != 'c' )
        {
            // get the terminal type
            pType = pCur;
            if ( *pCur == 'i' )
                vTerms = pNew->vPis;
            else if ( *pCur == 'l' )
                vTerms = pNew->vBoxes;
            else if ( *pCur == 'o' )
                vTerms = pNew->vPos;
            else
            {
                fprintf( stdout, "Wrong terminal type.\n" );
                return NULL;
            }
            // get the terminal number
            iTerm = atoi( ++pCur );  while ( *pCur++ != ' ' );
            // get the node
            if ( iTerm >= Vec_PtrSize(vTerms) )
            {
                fprintf( stdout, "The number of terminal is out of bound.\n" );
                return NULL;
            }
            pObj = Vec_PtrEntry( vTerms, iTerm );
            if ( *pType == 'l' )
                pObj = Aig_ObjFanout0(pObj);
            // assign the name
            pName = pCur;          while ( *pCur++ != '\n' );
            // assign this name 
            *(pCur-1) = 0;
            Aig_ObjAssignName( pObj, pName, NULL );
            if ( *pType == 'l' )
            {
                Aig_ObjAssignName( Aig_ObjFanin0(pObj), Aig_ObjName(pObj), "L" );
                Aig_ObjAssignName( Aig_ObjFanin0(Aig_ObjFanin0(pObj)), Aig_ObjName(pObj), "_in" );
            }
            // mark the node as named
            pObj->pCopy = (Aig_Obj_t *)Aig_ObjName(pObj);
        } 

        // assign the remaining names
        Aig_ManForEachCi( pNew, pObj, i )
        {
            if ( pObj->pCopy ) continue;
            Aig_ObjAssignName( pObj, Aig_ObjName(pObj), NULL );
            Counter++;
        }
        Aig_ManForEachLatchOutput( pNew, pObj, i )
        {
            if ( pObj->pCopy ) continue;
            Aig_ObjAssignName( pObj, Aig_ObjName(pObj), NULL );
            Aig_ObjAssignName( Aig_ObjFanin0(pObj), Aig_ObjName(pObj), "L" );
            Aig_ObjAssignName( Aig_ObjFanin0(Aig_ObjFanin0(pObj)), Aig_ObjName(pObj), "_in" );
            Counter++;
        }
        Aig_ManForEachCo( pNew, pObj, i )
        {
            if ( pObj->pCopy ) continue;
            Aig_ObjAssignName( pObj, Aig_ObjName(pObj), NULL );
            Counter++;
        }
        if ( Counter )
            printf( "Ioa_ReadAiger(): Added %d default names for nameless I/O/register objects.\n", Counter );
    }
    else
    {
//        printf( "Ioa_ReadAiger(): I/O/register names are not given. Generating short names.\n" );
        Aig_ManShortNames( pNew );
    }
*/
    pCur = pSymbols;
    if ( pCur + 1 < pContents + nFileSize && *pCur == 'c' )
    {
        pCur++;
        if ( *pCur == 'n' )
        {
            pCur++;
            // read model name
            ABC_FREE( pNew->pName );
            pNew->pName = Abc_UtilStrsav( pCur );
        }
    }

    // skipping the comments
    Vec_PtrFree( vNodes );

    // remove the extra nodes
    Aig_ManCleanup( pNew );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(pNew) );

    // update polarity of the additional outputs
    if ( nBad || nConstr || nJust || nFair )
        Aig_ManInvertConstraints( pNew );

    // check the result
    if ( fCheck && !Aig_ManCheck( pNew ) )
    {
        printf( "Ioa_ReadAiger: The network check has failed.\n" );
        Aig_ManStop( pNew );
        return NULL;
    }
    return pNew;
}